

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  undefined8 *puVar1;
  int iVar2;
  pointer pBVar3;
  int *piVar4;
  Allocator *pAVar5;
  pointer pMVar6;
  long *plVar7;
  Layer *pLVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Layer *pLVar10;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar11;
  Mat *pMVar12;
  int iVar13;
  long lVar14;
  void *pvVar15;
  int iVar16;
  int iVar17;
  size_t sVar18;
  long lVar19;
  int *piVar20;
  int top_count;
  int typeindex;
  int bottom_count;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  int bottom_blob_index;
  Option opt1;
  int local_140;
  uint local_13c;
  char local_135;
  int local_134;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_130;
  Net *local_128;
  Layer *local_120;
  int local_114;
  int local_110;
  int local_10c;
  vector<int,_std::allocator<int>_> *local_108;
  Net *local_100;
  vector<int,_std::allocator<int>_> *local_f8;
  int local_ec;
  ParamDict local_e8;
  Option *local_d8;
  Mat *local_d0;
  DataReader *local_c8;
  Mat local_c0;
  undefined1 local_78 [32];
  Allocator *local_58;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  undefined8 uStack_44;
  size_t local_38;
  
  local_ec = 0;
  iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_ec,4);
  if (CONCAT44(extraout_var,iVar9) == 4) {
    if (local_ec == 0x7685dd) {
      local_10c = 0;
      local_110 = 0;
      iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_10c,4);
      if (CONCAT44(extraout_var_00,iVar9) == 4) {
        iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_110,4);
        if (CONCAT44(extraout_var_01,iVar9) == 4) {
          if ((0 < (long)local_10c) && (0 < local_110)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)local_10c);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)local_110);
            ParamDict::ParamDict(&local_e8);
            if (0 < local_10c) {
              local_d8 = &this->opt;
              local_128 = (Net *)0x0;
              local_100 = this;
              local_c8 = dr;
              do {
                iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_13c,4);
                if (CONCAT44(extraout_var_02,iVar9) != 4) {
                  load_param_bin();
LAB_00134ded:
                  iVar9 = -1;
                  goto LAB_00134df2;
                }
                iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_134,4);
                if (CONCAT44(extraout_var_03,iVar9) != 4) {
                  load_param_bin();
                  goto LAB_00134ded;
                }
                iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_140,4);
                if (CONCAT44(extraout_var_04,iVar9) != 4) {
                  load_param_bin();
                  goto LAB_00134ded;
                }
                iVar9 = (*this->_vptr_Net[6])(this,(ulong)local_13c);
                pLVar10 = (Layer *)CONCAT44(extraout_var_05,iVar9);
                if ((pLVar10 == (Layer *)0x0) &&
                   (pLVar10 = create_layer_cpu(local_13c), pLVar10 == (Layer *)0x0)) {
                  iVar9 = (*this->_vptr_Net[5])(this,(ulong)(local_13c & 0xfffffeff));
                  pLVar10 = (Layer *)CONCAT44(extraout_var_06,iVar9);
                  if (pLVar10 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %d not exists or registered",(ulong)local_13c);
                    fputc(10,_stderr);
                    clear(this);
                    goto LAB_00134ded;
                  }
                }
                local_f8 = &pLVar10->bottoms;
                std::vector<int,_std::allocator<int>_>::resize(local_f8,(long)local_134);
                if (0 < local_134) {
                  lVar14 = 0;
                  do {
                    iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_c0,4);
                    if (CONCAT44(extraout_var_07,iVar9) != 4) {
                      load_param_bin();
                      goto LAB_00134ded;
                    }
                    (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_start[(int)local_c0.data].consumer =
                         (int)local_128;
                    (local_f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar14] = (int)local_c0.data;
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < local_134);
                }
                local_108 = &pLVar10->tops;
                std::vector<int,_std::allocator<int>_>::resize(local_108,(long)local_140);
                if (0 < local_140) {
                  lVar14 = 0;
                  do {
                    iVar9 = (*dr->_vptr_DataReader[3])(dr,&local_c0,4);
                    if (CONCAT44(extraout_var_08,iVar9) != 4) {
                      load_param_bin();
                      goto LAB_00134ded;
                    }
                    (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_start[(int)local_c0.data].producer =
                         (int)local_128;
                    (local_108->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar14] = (int)local_c0.data;
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < local_140);
                }
                local_135 = pLVar10->support_vulkan;
                iVar9 = ParamDict::load_param_bin(&local_e8,dr);
                if (iVar9 == 0) {
                  local_38 = 0;
                  local_78._0_8_ = (void *)0x0;
                  local_78._8_4_ = 0;
                  local_78._12_4_ = 0;
                  local_78._16_4_ = 0;
                  local_78._20_8_ = 0;
                  iStack_48 = 0;
                  uStack_44._0_4_ = 0;
                  uStack_44._4_4_ = 0;
                  local_58 = (Allocator *)0x0;
                  iStack_50 = 0;
                  iStack_4c = 0;
                  local_120 = pLVar10;
                  ParamDict::get(&local_c0,&local_e8,0x1e,(Mat *)local_78);
                  piVar20 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
                  if (piVar20 != (int *)0x0) {
                    LOCK();
                    *piVar20 = *piVar20 + -1;
                    UNLOCK();
                    if (*piVar20 == 0) {
                      if (local_58 == (Allocator *)0x0) {
                        if ((void *)local_78._0_8_ != (void *)0x0) {
                          free((void *)local_78._0_8_);
                        }
                      }
                      else {
                        (*local_58->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if (((CONCAT44(local_c0.data._4_4_,(int)local_c0.data) != 0) &&
                      ((long)local_c0.c * local_c0.cstep != 0)) && (0 < local_140)) {
                    piVar20 = (int *)(CONCAT44(local_c0.data._4_4_,(int)local_c0.data) + 0xc);
                    lVar14 = 0;
                    do {
                      iVar9 = (local_108->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar14];
                      pBVar3 = (local_100->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      iVar2 = piVar20[-3];
                      if (iVar2 == 3) {
                        pvVar11 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(long)piVar20[-2]
                        ;
                        iVar13 = piVar20[-1];
                        iVar17 = *piVar20;
                        sVar18 = (long)iVar13 * (long)pvVar11 + 3U & 0x3ffffffffffffffc;
                        pMVar12 = &pBVar3[iVar9].shape;
                        piVar4 = pBVar3[iVar9].shape.refcount;
                        iVar16 = 3;
                        if (piVar4 != (int *)0x0) {
                          LOCK();
                          *piVar4 = *piVar4 + -1;
                          UNLOCK();
                          if (*piVar4 == 0) {
                            pvVar15 = pBVar3[iVar9].shape.data;
                            pAVar5 = pBVar3[iVar9].shape.allocator;
                            if (pAVar5 == (Allocator *)0x0) {
LAB_001348bc:
                              pMVar12 = &pBVar3[iVar9].shape;
                              if (pvVar15 != (void *)0x0) {
                                local_130 = pvVar11;
                                local_114 = iVar17;
                                local_d0 = &pBVar3[iVar9].shape;
                                free(pvVar15);
                                pvVar11 = local_130;
                                pMVar12 = local_d0;
                                iVar17 = local_114;
                                iVar16 = iVar2;
                              }
                            }
                            else {
                              local_130 = pvVar11;
                              local_114 = iVar17;
                              (*pAVar5->_vptr_Allocator[3])();
                              iVar16 = 3;
                              pvVar11 = local_130;
                              iVar17 = local_114;
                            }
                          }
                        }
LAB_001348ea:
                        pMVar12->data = (void *)0x0;
                        pMVar12->refcount = (int *)0x0;
                        pBVar3[iVar9].shape.elemsize = 4;
                        pBVar3[iVar9].shape.elempack = 1;
                        pBVar3[iVar9].shape.allocator = (Allocator *)0x0;
                        pBVar3[iVar9].shape.dims = iVar16;
                        pBVar3[iVar9].shape.w = (int)pvVar11;
                        pBVar3[iVar9].shape.h = iVar13;
                        pBVar3[iVar9].shape.d = 1;
                        pBVar3[iVar9].shape.c = iVar17;
                        pBVar3[iVar9].shape.cstep = sVar18;
                      }
                      else {
                        if (iVar2 == 2) {
                          pvVar11 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                    (long)piVar20[-2];
                          iVar13 = piVar20[-1];
                          sVar18 = (long)iVar13 * (long)pvVar11;
                          pMVar12 = &pBVar3[iVar9].shape;
                          piVar4 = pBVar3[iVar9].shape.refcount;
                          iVar17 = 1;
                          iVar16 = 2;
                          if (piVar4 != (int *)0x0) {
                            LOCK();
                            *piVar4 = *piVar4 + -1;
                            UNLOCK();
                            if (*piVar4 == 0) {
                              pvVar15 = pBVar3[iVar9].shape.data;
                              pAVar5 = pBVar3[iVar9].shape.allocator;
                              if (pAVar5 == (Allocator *)0x0) goto LAB_001348bc;
                              local_130 = pvVar11;
                              (*pAVar5->_vptr_Allocator[3])();
                              iVar16 = 2;
                              pvVar11 = local_130;
                              iVar17 = 1;
                            }
                          }
                          goto LAB_001348ea;
                        }
                        if (iVar2 == 1) {
                          pvVar11 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                    (ulong)(uint)piVar20[-2];
                          sVar18 = (size_t)piVar20[-2];
                          pMVar12 = &pBVar3[iVar9].shape;
                          piVar4 = pBVar3[iVar9].shape.refcount;
                          iVar16 = 1;
                          if (piVar4 != (int *)0x0) {
                            LOCK();
                            *piVar4 = *piVar4 + -1;
                            UNLOCK();
                            if (*piVar4 == 0) {
                              pvVar15 = pBVar3[iVar9].shape.data;
                              pAVar5 = pBVar3[iVar9].shape.allocator;
                              if (pAVar5 == (Allocator *)0x0) {
                                iVar13 = 1;
                                iVar17 = 1;
                                goto LAB_001348bc;
                              }
                              (*pAVar5->_vptr_Allocator[3])();
                              iVar13 = 1;
                              iVar17 = 1;
                              iVar16 = 1;
                              goto LAB_001348ea;
                            }
                          }
                          iVar13 = 1;
                          iVar17 = 1;
                          goto LAB_001348ea;
                        }
                      }
                      lVar14 = lVar14 + 1;
                      piVar20 = piVar20 + 4;
                    } while (lVar14 < local_140);
                  }
                  local_130 = &local_120->bottom_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                            (local_130,(long)local_134);
                  this = local_100;
                  if (0 < local_134) {
                    lVar14 = 0;
                    lVar19 = 0;
                    pvVar11 = local_130;
                    iVar9 = local_134;
                    do {
                      iVar2 = (local_f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar19];
                      pBVar3 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar6 = (pvVar11->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar1 = (undefined8 *)((long)&pMVar6->data + lVar14);
                      if ((Mat *)puVar1 != &pBVar3[iVar2].shape) {
                        piVar20 = pBVar3[iVar2].shape.refcount;
                        if (piVar20 != (int *)0x0) {
                          LOCK();
                          *piVar20 = *piVar20 + 1;
                          UNLOCK();
                        }
                        piVar20 = *(int **)((long)&pMVar6->refcount + lVar14);
                        if (piVar20 != (int *)0x0) {
                          LOCK();
                          *piVar20 = *piVar20 + -1;
                          UNLOCK();
                          if (*piVar20 == 0) {
                            pvVar15 = *(void **)((long)&pMVar6->data + lVar14);
                            plVar7 = *(long **)((long)&pMVar6->allocator + lVar14);
                            if (plVar7 == (long *)0x0) {
                              if (pvVar15 != (void *)0x0) {
                                free(pvVar15);
                                pvVar11 = local_130;
                              }
                            }
                            else {
                              (**(code **)(*plVar7 + 0x18))();
                              pvVar11 = local_130;
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar6->cstep + lVar14) = 0;
                        *(undefined8 *)((long)puVar1 + 0xc) = 0;
                        *(undefined8 *)((long)puVar1 + 0x14) = 0;
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        puVar1 = (undefined8 *)((long)&pMVar6->dims + lVar14);
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        *(undefined4 *)((long)&pMVar6->c + lVar14) = 0;
                        piVar20 = pBVar3[iVar2].shape.refcount;
                        puVar1 = (undefined8 *)((long)&pMVar6->data + lVar14);
                        *puVar1 = pBVar3[iVar2].shape.data;
                        puVar1[1] = piVar20;
                        *(size_t *)((long)&pMVar6->elemsize + lVar14) = pBVar3[iVar2].shape.elemsize
                        ;
                        *(int *)((long)&pMVar6->elempack + lVar14) = pBVar3[iVar2].shape.elempack;
                        *(Allocator **)((long)&pMVar6->allocator + lVar14) =
                             pBVar3[iVar2].shape.allocator;
                        iVar9 = pBVar3[iVar2].shape.w;
                        iVar13 = pBVar3[iVar2].shape.h;
                        iVar17 = pBVar3[iVar2].shape.d;
                        piVar20 = (int *)((long)&pMVar6->dims + lVar14);
                        *piVar20 = pBVar3[iVar2].shape.dims;
                        piVar20[1] = iVar9;
                        piVar20[2] = iVar13;
                        piVar20[3] = iVar17;
                        *(int *)((long)&pMVar6->c + lVar14) = pBVar3[iVar2].shape.c;
                        *(size_t *)((long)&pMVar6->cstep + lVar14) = pBVar3[iVar2].shape.cstep;
                        iVar9 = local_134;
                      }
                      lVar19 = lVar19 + 1;
                      lVar14 = lVar14 + 0x48;
                    } while (lVar19 < iVar9);
                  }
                  pvVar11 = &local_120->top_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                            (pvVar11,(long)local_140);
                  if (0 < local_140) {
                    lVar14 = 0;
                    lVar19 = 0;
                    iVar9 = local_140;
                    do {
                      iVar2 = (local_108->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar19];
                      pBVar3 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar6 = (pvVar11->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar1 = (undefined8 *)((long)&pMVar6->data + lVar14);
                      if ((Mat *)puVar1 != &pBVar3[iVar2].shape) {
                        piVar20 = pBVar3[iVar2].shape.refcount;
                        if (piVar20 != (int *)0x0) {
                          LOCK();
                          *piVar20 = *piVar20 + 1;
                          UNLOCK();
                        }
                        piVar20 = *(int **)((long)&pMVar6->refcount + lVar14);
                        if (piVar20 != (int *)0x0) {
                          LOCK();
                          *piVar20 = *piVar20 + -1;
                          UNLOCK();
                          if (*piVar20 == 0) {
                            pvVar15 = *(void **)((long)&pMVar6->data + lVar14);
                            plVar7 = *(long **)((long)&pMVar6->allocator + lVar14);
                            if (plVar7 == (long *)0x0) {
                              if (pvVar15 != (void *)0x0) {
                                free(pvVar15);
                              }
                            }
                            else {
                              (**(code **)(*plVar7 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar6->cstep + lVar14) = 0;
                        *(undefined8 *)((long)puVar1 + 0xc) = 0;
                        *(undefined8 *)((long)puVar1 + 0x14) = 0;
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        puVar1 = (undefined8 *)((long)&pMVar6->dims + lVar14);
                        *puVar1 = 0;
                        puVar1[1] = 0;
                        *(undefined4 *)((long)&pMVar6->c + lVar14) = 0;
                        piVar20 = pBVar3[iVar2].shape.refcount;
                        puVar1 = (undefined8 *)((long)&pMVar6->data + lVar14);
                        *puVar1 = pBVar3[iVar2].shape.data;
                        puVar1[1] = piVar20;
                        *(size_t *)((long)&pMVar6->elemsize + lVar14) = pBVar3[iVar2].shape.elemsize
                        ;
                        *(int *)((long)&pMVar6->elempack + lVar14) = pBVar3[iVar2].shape.elempack;
                        *(Allocator **)((long)&pMVar6->allocator + lVar14) =
                             pBVar3[iVar2].shape.allocator;
                        iVar9 = pBVar3[iVar2].shape.w;
                        iVar13 = pBVar3[iVar2].shape.h;
                        iVar17 = pBVar3[iVar2].shape.d;
                        piVar20 = (int *)((long)&pMVar6->dims + lVar14);
                        *piVar20 = pBVar3[iVar2].shape.dims;
                        piVar20[1] = iVar9;
                        piVar20[2] = iVar13;
                        piVar20[3] = iVar17;
                        *(int *)((long)&pMVar6->c + lVar14) = pBVar3[iVar2].shape.c;
                        *(size_t *)((long)&pMVar6->cstep + lVar14) = pBVar3[iVar2].shape.cstep;
                        iVar9 = local_140;
                      }
                      lVar19 = lVar19 + 1;
                      lVar14 = lVar14 + 0x48;
                      this = local_100;
                    } while (lVar19 < iVar9);
                  }
                  iVar9 = ParamDict::get(&local_e8,0x1f,0);
                  local_120->featmask = iVar9;
                  iVar9 = (*local_120->_vptr_Layer[2])(local_120,&local_e8);
                  dr = local_c8;
                  pLVar10 = local_120;
                  if (iVar9 == 0) {
                    if (local_120->support_int8_storage == true) {
                      (this->opt).use_vulkan_compute = false;
                    }
                    get_masked_option((Option *)local_78,local_d8,local_120->featmask);
                    if ((local_135 != '\0') &&
                       ((pLVar10->support_vulkan != true ||
                        (pLVar10 = local_120, local_78[0x1f] == false)))) {
                      iVar9 = (*this->_vptr_Net[6])(this,(ulong)local_13c);
                      pLVar10 = (Layer *)CONCAT44(extraout_var_09,iVar9);
                      if ((pLVar10 == (Layer *)0x0) &&
                         (pLVar10 = create_layer_cpu(local_13c), pLVar10 == (Layer *)0x0)) {
                        iVar9 = (*this->_vptr_Net[5])(this,(ulong)(local_13c & 0xfffffeff));
                        pLVar10 = (Layer *)CONCAT44(extraout_var_10,iVar9);
                        if (pLVar10 != (Layer *)0x0) goto LAB_00134c54;
                        fprintf(_stderr,"layer %d not exists or registered",(ulong)local_13c);
                        fputc(10,_stderr);
                        iVar9 = 1;
                        clear(this);
                        goto LAB_00134cd4;
                      }
LAB_00134c54:
                      std::vector<int,_std::allocator<int>_>::operator=(&pLVar10->bottoms,local_f8);
                      std::vector<int,_std::allocator<int>_>::operator=(&pLVar10->tops,local_108);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                (&pLVar10->bottom_shapes,local_130);
                      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                                (&pLVar10->top_shapes,pvVar11);
                      pLVar8 = local_120;
                      pLVar10->featmask = local_120->featmask;
                      iVar9 = (*pLVar10->_vptr_Layer[2])(pLVar10,&local_e8);
                      if (iVar9 != 0) {
                        load_param_bin(local_128);
                        goto LAB_00134d7f;
                      }
                      (*pLVar8->_vptr_Layer[1])(pLVar8);
                    }
                    (this->d->layers).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)local_128] = pLVar10;
                    iVar9 = 0;
                  }
                  else {
                    load_param_bin(local_128);
LAB_00134d7f:
                    iVar9 = 0xe;
                  }
LAB_00134cd4:
                  if (local_c0.refcount != (int *)0x0) {
                    LOCK();
                    *local_c0.refcount = *local_c0.refcount + -1;
                    UNLOCK();
                    if (*local_c0.refcount == 0) {
                      if (local_c0.allocator == (Allocator *)0x0) {
                        if ((void *)CONCAT44(local_c0.data._4_4_,(int)local_c0.data) != (void *)0x0)
                        {
                          free((void *)CONCAT44(local_c0.data._4_4_,(int)local_c0.data));
                        }
                      }
                      else {
                        (*(local_c0.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if ((iVar9 != 0xe) && (iVar9 != 0)) goto LAB_00134ded;
                }
                else {
                  fprintf(_stderr,"ParamDict load_param_bin %d failed",local_128);
                  fputc(10,_stderr);
                }
                local_128 = (Net *)((long)&local_128->_vptr_Net + 1);
              } while ((long)local_128 < (long)local_10c);
            }
            iVar9 = 0;
            NetPrivate::update_input_output_indexes(this->d);
LAB_00134df2:
            ParamDict::~ParamDict(&local_e8);
            return iVar9;
          }
          load_param_bin();
        }
        else {
          load_param_bin();
        }
      }
      else {
        load_param_bin();
      }
    }
    else {
      load_param_bin();
    }
  }
  else {
    load_param_bin();
  }
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#if __BIG_ENDIAN__
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }                                              \
    if (sizeof(buf) == 2)                          \
        swap_endianness_16(&buf);                  \
    if (sizeof(buf) == 4)                          \
        swap_endianness_32(&buf);
#else
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }
#endif

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev)
        {
            int device_index = opt.vulkan_device_index;
            if (device_index < 0 || device_index >= get_gpu_count())
                device_index = get_default_gpu_index();

            d->vkdev = get_gpu_device(device_index);
        }
        if (!d->vkdev || !d->vkdev->is_valid()) opt.use_vulkan_compute = false; // no valid vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_uniform()) opt.use_fp16_uniform = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_packed()) opt.use_int8_packed = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_uniform()) opt.use_int8_uniform = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;
        if (!d->vkdev->info.support_subgroup_ops()) opt.use_subgroup_ops = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        if (opt.use_image_storage && !d->vkdev->info.support_fp16_image())
        {
            opt.use_fp16_storage = false;
            opt.use_fp16_uniform = false;
        }

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;

        // fp16 uniform makes no sense when fp16 arithmetic disabled
        if (!opt.use_fp16_arithmetic) opt.use_fp16_uniform = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_overwrite_builtin_layer(typeindex);
#if NCNN_VULKAN
        if (!layer && opt.use_vulkan_compute && d->vkdev)
        {
            layer = create_layer_vulkan(typeindex);
        }
#endif // NCNN_VULKAN
        if (!layer)
        {
            layer = create_layer_cpu(typeindex);
        }
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        int layer_support_vulkan = layer->support_vulkan;

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param_bin %d failed", i);
            continue;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d failed", i);
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (opt1.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        if (layer_support_vulkan && (!layer->support_vulkan || !opt1.use_vulkan_compute))
        {
            // vulkan layer cannot handle these param, recreate cpu layer
            Layer* layer_cpu = create_overwrite_builtin_layer(typeindex);
            if (!layer_cpu)
            {
                layer_cpu = create_layer_cpu(typeindex);
            }
            if (!layer_cpu)
            {
                int custom_index = typeindex & ~LayerType::CustomBit;
                layer_cpu = create_custom_layer(custom_index);
            }
            if (!layer_cpu)
            {
                NCNN_LOGE("layer %d not exists or registered", typeindex);
                clear();
                return -1;
            }

            layer_cpu->bottoms = layer->bottoms;
            layer_cpu->tops = layer->tops;
            layer_cpu->bottom_shapes = layer->bottom_shapes;
            layer_cpu->top_shapes = layer->top_shapes;
            layer_cpu->featmask = layer->featmask;

            int lr = layer_cpu->load_param(pd);
            if (lr != 0)
            {
                NCNN_LOGE("layer load_param %d failed", i);
                continue;
            }

            delete layer;
            layer = layer_cpu;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}